

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warning.cpp
# Opt level: O1

bool tryProcessParamWarning(char *flag,uint8_t param,WarningState state)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  WarningState WVar5;
  ulong uVar6;
  bool local_41;
  int local_3c;
  
  local_3c = 0x10;
  local_41 = true;
  uVar6 = 0;
  while( true ) {
    bVar1 = paramWarnings[uVar6].nbLevels;
    iVar3 = strcmp(paramWarnings[uVar6].name,flag);
    bVar2 = param;
    if (iVar3 == 0) {
      if ((state == WARNING_DISABLED) || (param != 0)) {
        if ((bVar1 < param) && (bVar2 = bVar1, param != 0xff)) {
          warnx("Got parameter %u for warning flag \"%s\", but the maximum is %u; capping.\n",
                (ulong)param,flag,(ulong)bVar1);
        }
      }
      else {
        bVar2 = paramWarnings[uVar6].defaultLevel;
      }
      if (bVar1 != 0) {
        uVar4 = 0;
        do {
          WVar5 = WARNING_DISABLED;
          if (uVar4 < bVar2) {
            WVar5 = state;
          }
          warningStates[uVar4 + (long)local_3c] = WVar5;
          uVar4 = uVar4 + 1;
        } while (bVar1 != uVar4);
      }
    }
    else {
      local_3c = local_3c + (uint)bVar1;
    }
    if (iVar3 == 0) break;
    local_41 = uVar6 < 2;
    uVar6 = uVar6 + 1;
    param = bVar2;
    if (uVar6 == 3) {
      return local_41;
    }
  }
  return local_41;
}

Assistant:

static bool tryProcessParamWarning(char const *flag, uint8_t param, enum WarningState state)
{
	enum WarningID baseID = PARAM_WARNINGS_START;

	for (size_t i = 0; i < ARRAY_SIZE(paramWarnings); i++) {
		uint8_t maxParam = paramWarnings[i].nbLevels;

		if (!strcmp(paramWarnings[i].name, flag)) { // Match!
			// If making the warning an error but param is 0, set to the maximum
			// This accommodates `-Werror=flag`, but also `-Werror=flag=0`, which is
			// thus filtered out by the caller.
			// A param of 0 makes sense for disabling everything, but neither for
			// enabling nor "erroring". Use the default for those.
			if (param == 0 && state != WARNING_DISABLED) {
				param = paramWarnings[i].defaultLevel;
			} else if (param > maxParam) {
				if (param != 255) // Don't  warn if already capped
					warnx("Got parameter %" PRIu8
					      " for warning flag \"%s\", but the maximum is %"
					      PRIu8 "; capping.\n",
					      param, flag, maxParam);
				param = maxParam;
			}

			// Set the first <param> to enabled/error, and disable the rest
			for (uint8_t ofs = 0; ofs < maxParam; ofs++) {
				warningStates[baseID + ofs] =
					ofs < param ? state : WARNING_DISABLED;
			}
			return true;
		}

		baseID = (enum WarningID)(baseID + maxParam);
	}
	return false;
}